

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O0

size_type __thiscall avro::detail::BufferImpl::wroteTo(BufferImpl *this,size_type size)

{
  unsigned_long *puVar1;
  BufferImpl *in_RSI;
  size_type wrote;
  Chunk *chunk;
  size_type bytesLeft;
  size_type local_30;
  unsigned_long local_28;
  reference in_stack_ffffffffffffffe0;
  BufferImpl *this_00;
  
  this_00 = in_RSI;
  for (; in_RSI != (BufferImpl *)0x0; in_RSI = (BufferImpl *)((long)in_RSI - local_28)) {
    in_stack_ffffffffffffffe0 =
         std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::front
                   ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
                    in_stack_ffffffffffffffe0);
    local_30 = Chunk::freeSize(in_stack_ffffffffffffffe0);
    puVar1 = std::min<unsigned_long>(&local_30,(unsigned_long *)&stack0xffffffffffffffe8);
    local_28 = *puVar1;
    postWrite(this_00,(size_type)in_RSI);
  }
  return (size_type)this_00;
}

Assistant:

size_type wroteTo(size_type size) 
    {
        assert(size <= freeSpace_);
        size_type bytesLeft = size;
        while (bytesLeft) {

            Chunk &chunk = writeChunks_.front();
            size_type wrote = std::min<size_type>(chunk.freeSize(), bytesLeft);
            assert(wrote);
            postWrite(wrote);
            bytesLeft -= wrote;
        }
        return size;
    }